

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift,__m128i *clip_low,__m128i *clip_high,
               __m128i *max_mask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 extraout_XMM0_Qa;
  uint16_t *dst_00;
  CONV_BUF_TYPE *src0_00;
  CONV_BUF_TYPE *src1_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  void *in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i mask_sb;
  __m128i mask_sa;
  __m128i mask_16b;
  __m128i mask_16a;
  __m128i mask_bothrowsb;
  __m128i mask_bothrowsa;
  __m128i mask_nextrowb;
  __m128i mask_thisrowb;
  __m128i mask_nextrowa;
  __m128i mask_thisrowa;
  __m128i two_w;
  __m128i one_b;
  __m128i *in_stack_00000430;
  __m128i *in_stack_00000438;
  __m128i *in_stack_00000440;
  int in_stack_00000448;
  __m128i *in_stack_00000450;
  __m128i *in_stack_00000458;
  __m128i *in_stack_00000460;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined4 uStack_80;
  int src0_stride_00;
  undefined4 uStack_70;
  int dst_stride_00;
  
  do {
    xx_loadu_128(in_stack_00000008);
    xx_loadu_128((void *)((long)in_stack_00000008 + (ulong)in_stack_00000010));
    xx_loadu_128((void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 1)));
    xx_loadu_128((void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 * 3)));
    auVar3._8_8_ = extraout_XMM0_Qb;
    auVar3._0_8_ = extraout_XMM0_Qa;
    auVar2._8_8_ = extraout_XMM0_Qb_00;
    auVar2._0_8_ = dst_00;
    auVar4 = paddusb(auVar3,auVar2);
    uStack_70 = (undefined4)extraout_XMM0_Qb_01;
    dst_stride_00 = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    uStack_80 = (undefined4)extraout_XMM0_Qb_02;
    src0_stride_00 = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
    auVar1._8_4_ = uStack_70;
    auVar1._0_8_ = src0_00;
    auVar1._12_4_ = dst_stride_00;
    auVar5._8_4_ = uStack_80;
    auVar5._0_8_ = src1_00;
    auVar5._12_4_ = src0_stride_00;
    auVar5 = paddusb(auVar1,auVar5);
    auVar6._8_8_ = 0x101010101010101;
    auVar6._0_8_ = 0x101010101010101;
    auVar6 = pmaddubsw(auVar4,auVar6);
    auVar4._8_8_ = 0x101010101010101;
    auVar4._0_8_ = 0x101010101010101;
    pmaddubsw(auVar5,auVar4);
    uStack_cc = auVar6._12_2_;
    uStack_ca = auVar6._14_2_;
    highbd_blend_a64_d16_mask_w8_sse4_1
              (dst_00,dst_stride_00,src0_00,src0_stride_00,src1_00,
               CONCAT22(uStack_ca + 2,uStack_cc + 2),in_stack_00000430,in_stack_00000438,
               in_stack_00000440,in_stack_00000448,in_stack_00000450,in_stack_00000458,
               in_stack_00000460);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 2));
    in_stack_00000018 = in_stack_00000018 + -2;
  } while (in_stack_00000018 != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift, const __m128i *clip_low,
    const __m128i *clip_high, const __m128i *max_mask) {
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i two_w = _mm_set1_epi16(2);
  do {
    const __m128i mask_thisrowa = xx_loadu_128(mask);
    const __m128i mask_nextrowa = xx_loadu_128(mask + mask_stride);
    const __m128i mask_thisrowb = xx_loadu_128(mask + 2 * mask_stride);
    const __m128i mask_nextrowb = xx_loadu_128(mask + 3 * mask_stride);
    const __m128i mask_bothrowsa = _mm_adds_epu8(mask_thisrowa, mask_nextrowa);
    const __m128i mask_bothrowsb = _mm_adds_epu8(mask_thisrowb, mask_nextrowb);
    const __m128i mask_16a = _mm_maddubs_epi16(mask_bothrowsa, one_b);
    const __m128i mask_16b = _mm_maddubs_epi16(mask_bothrowsb, one_b);
    const __m128i mask_sa = _mm_srli_epi16(_mm_add_epi16(mask_16a, two_w), 2);
    const __m128i mask_sb = _mm_srli_epi16(_mm_add_epi16(mask_16b, two_w), 2);

    highbd_blend_a64_d16_mask_w8_sse4_1(
        dst, dst_stride, src0, src0_stride, src1, src1_stride, &mask_sa,
        &mask_sb, round_offset, shift, clip_low, clip_high, max_mask);

    dst += dst_stride * 2;
    src0 += src0_stride * 2;
    src1 += src1_stride * 2;
    mask += mask_stride * 4;
  } while (h -= 2);
}